

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void inplace_flip_container(roaring_array_t *x1_arr,uint16_t hb,uint16_t lb_start,uint16_t lb_end)

{
  ushort uVar1;
  bool bVar2;
  run_container_t *c;
  _Bool _Var3;
  uint8_t uVar4;
  array_container_t *paVar5;
  uint8_t uVar6;
  int iVar7;
  uint uVar8;
  run_container_t *run;
  uint i;
  uint uVar9;
  uint uVar10;
  uint8_t local_31;
  run_container_t *local_30;
  
  iVar7 = x1_arr->size;
  if (((long)iVar7 == 0) || (x1_arr->keys[(long)iVar7 + -1] == hb)) {
    i = iVar7 - 1;
  }
  else {
    uVar9 = iVar7 - 1;
    uVar8 = 0;
    uVar10 = uVar9;
    do {
      if ((int)uVar9 < (int)uVar8) {
        i = ~uVar8;
        break;
      }
      i = uVar8 + uVar9 >> 1;
      uVar1 = *(ushort *)((long)x1_arr->keys + (ulong)(uVar8 + uVar9 & 0xfffffffe));
      if (uVar1 < hb) {
        uVar8 = i + 1;
        bVar2 = true;
        i = uVar10;
      }
      else if (hb < uVar1) {
        uVar9 = i - 1;
        bVar2 = true;
        i = uVar10;
      }
      else {
        bVar2 = false;
      }
      uVar10 = i;
    } while (bVar2);
  }
  if ((int)i < 0) {
    uVar10 = (uint)lb_start;
    iVar7 = lb_end - uVar10;
    if (iVar7 + 2U < 3) {
      paVar5 = array_container_create_range(uVar10,lb_end + 1);
      uVar6 = '\x02';
    }
    else {
      paVar5 = (array_container_t *)run_container_create_given_capacity(1);
      uVar6 = '\x03';
      if (paVar5 != (array_container_t *)0x0) {
        *(uint *)(paVar5->array + (long)paVar5->cardinality * 2) = iVar7 * 0x10000 | uVar10;
        paVar5->cardinality = paVar5->cardinality + 1;
      }
    }
    ra_insert_new_key_value_at(x1_arr,~i,hb,paVar5,uVar6);
    return;
  }
  local_31 = x1_arr->typecodes[i & 0xffff];
  paVar5 = (array_container_t *)x1_arr->containers[i & 0xffff];
  if (local_31 == '\x04') {
    paVar5 = (array_container_t *)
             shared_container_extract_copy((shared_container_t *)paVar5,&local_31);
  }
  uVar10 = (uint)lb_start;
  iVar7 = lb_end + 1;
  local_30 = (run_container_t *)0x0;
  if (local_31 == '\x03') {
    iVar7 = run_container_negation_range_inplace((run_container_t *)paVar5,uVar10,iVar7,&local_30);
    uVar6 = (uint8_t)iVar7;
  }
  else {
    if (local_31 == '\x02') {
      _Var3 = array_container_negation_range_inplace(paVar5,uVar10,iVar7,&local_30);
    }
    else {
      _Var3 = bitset_container_negation_range_inplace
                        ((bitset_container_t *)paVar5,uVar10,iVar7,&local_30);
    }
    uVar6 = '\x02' - _Var3;
  }
  c = local_30;
  run = local_30;
  uVar4 = uVar6;
  if (uVar6 == '\x04') {
    uVar4 = *(uint8_t *)&local_30->runs;
    run = *(run_container_t **)local_30;
  }
  if (uVar4 == '\x03') {
    iVar7 = run_container_cardinality(run);
  }
  else {
    iVar7 = run->n_runs;
  }
  if (iVar7 == 0) {
    container_free(c,uVar6);
    ra_remove_at_index(x1_arr,i);
  }
  else {
    x1_arr->containers[i] = c;
    x1_arr->typecodes[i] = uVar6;
  }
  return;
}

Assistant:

static void inplace_flip_container(roaring_array_t *x1_arr, uint16_t hb,
                                   uint16_t lb_start, uint16_t lb_end) {
    const int i = ra_get_index(x1_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, (uint16_t)i, &ctype_in);
        flipped_container = container_inot_range(
            container_to_flip, ctype_in, (uint32_t)lb_start,
            (uint32_t)(lb_end + 1), &ctype_out);
        // if a new container was created, the old one was already freed
        if (container_get_cardinality(flipped_container, ctype_out)) {
            ra_set_container_at_index(x1_arr, i, flipped_container, ctype_out);
        } else {
            container_free(flipped_container, ctype_out);
            ra_remove_at_index(x1_arr, i);
        }

    } else {
        flipped_container = container_range_of_ones(
            (uint32_t)lb_start, (uint32_t)(lb_end + 1), &ctype_out);
        ra_insert_new_key_value_at(x1_arr, -i - 1, hb, flipped_container,
                                   ctype_out);
    }
}